

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

int near_capacity(void)

{
  int iVar1;
  
  iVar1 = calc_capacity(0);
  return iVar1;
}

Assistant:

int near_capacity(void)
{
    return calc_capacity(0);
}